

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_id_unix.h
# Opt level: O2

bool CpuInformation::isAvxSupported(void)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = false;
  piVar1 = (int *)cpuid_basic_info(0);
  if (6 < *piVar1) {
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    bVar3 = SUB41((*(uint *)(lVar2 + 4) & 0x20) >> 5,0);
  }
  return bVar3;
}

Assistant:

static bool isAvxSupported()
    {
#ifndef __arm__
        int info[4];
        __cpuid_count( 0, 0, info[0], info[1], info[2], info[3] );
        const int id = info[0];

        if( id >= 0x00000007 ) {
            __cpuid_count( 0x00000007, 0, info[0], info[1], info[2], info[3] );
            return (info[1] & ((int)1 << 5)) != 0;
        }
#endif
        return false;
    }